

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O3

QSize __thiscall QProgressDialog::sizeHint(QProgressDialog *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int extraout_var;
  QStyle *pQVar6;
  int extraout_var_00;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  undefined8 local_40;
  
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  if (*(long **)(lVar1 + 0x2e0) == (long *)0x0) {
    local_40 = 0;
    iVar9 = 0;
  }
  else {
    local_40 = (**(code **)(**(long **)(lVar1 + 0x2e0) + 0x70))();
    iVar9 = (int)((ulong)local_40 >> 0x20);
  }
  (**(code **)(**(long **)(lVar1 + 0x2f0) + 0x70))();
  pQVar6 = QWidget::style((QWidget *)this);
  iVar2 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x4e,0,this);
  pQVar6 = QWidget::style((QWidget *)this);
  iVar3 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x50,0,this);
  pQVar6 = QWidget::style((QWidget *)this);
  iVar4 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x4b,0,this);
  pQVar6 = QWidget::style((QWidget *)this);
  iVar5 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x4d,0,this);
  uVar10 = extraout_var + iVar9 + iVar2 * 2 + iVar3;
  if (*(long **)(lVar1 + 0x2e8) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x2e8) + 0x70))();
    uVar10 = uVar10 + iVar3 + extraout_var_00;
  }
  uVar8 = iVar4 + (int)local_40 + iVar5;
  uVar7 = 200;
  if (200 < (int)uVar8) {
    uVar7 = (ulong)uVar8;
  }
  return (QSize)(uVar7 | (ulong)uVar10 << 0x20);
}

Assistant:

QSize QProgressDialog::sizeHint() const
{
    Q_D(const QProgressDialog);
    QSize labelSize = d->label ? d->label->sizeHint() : QSize(0, 0);
    QSize barSize = d->bar->sizeHint();
    int marginBottom = style()->pixelMetric(QStyle::PM_LayoutBottomMargin, 0, this);
    int spacing = style()->pixelMetric(QStyle::PM_LayoutVerticalSpacing, 0, this);
    int marginLeft = style()->pixelMetric(QStyle::PM_LayoutLeftMargin, 0, this);
    int marginRight = style()->pixelMetric(QStyle::PM_LayoutRightMargin, 0, this);

    int height = marginBottom * 2 + barSize.height() + labelSize.height() + spacing;
    if (d->cancel)
        height += d->cancel->sizeHint().height() + spacing;
    return QSize(qMax(200, labelSize.width() + marginLeft + marginRight), height);
}